

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O3

void __thiscall
QuantLib::EndCriteria::EndCriteria
          (EndCriteria *this,size_t maxIterations,size_t maxStationaryStateIterations,
          RealType rootEpsilon,RealType functionEpsilon,RealType gradientNormEpsilon)

{
  this->maxIterations_ = maxIterations;
  this->maxStationaryStateIterations_ = maxStationaryStateIterations;
  this->rootEpsilon_ = rootEpsilon;
  this->functionEpsilon_ = functionEpsilon;
  this->gradientNormEpsilon_ = gradientNormEpsilon;
  if (maxStationaryStateIterations < 2) {
    snprintf(painCave.errMsg,2000,"maxStationaryStateIterations_ ( %lu ) must be greater than one\n"
            );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    maxIterations = this->maxIterations_;
    maxStationaryStateIterations = this->maxStationaryStateIterations_;
  }
  if (maxStationaryStateIterations <= maxIterations) {
    return;
  }
  snprintf(painCave.errMsg,2000,
           "maxStationaryStateIterations_ ( %lu ) must be less than maxIterations_ ( %lu )\n");
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return;
}

Assistant:

EndCriteria::EndCriteria(size_t maxIterations,
                           size_t maxStationaryStateIterations,
                           RealType rootEpsilon, RealType functionEpsilon,
                           RealType gradientNormEpsilon) :
      maxIterations_(maxIterations),
      maxStationaryStateIterations_(maxStationaryStateIterations),
      rootEpsilon_(rootEpsilon), functionEpsilon_(functionEpsilon),
      gradientNormEpsilon_(gradientNormEpsilon) {
    // replaced the QL_REQUIRE macro with OpenMD's simError calls
    if (maxStationaryStateIterations_ <= 1) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "maxStationaryStateIterations_ ( %lu ) "
               "must be greater than one\n",
               (unsigned long)maxStationaryStateIterations_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
    if (maxStationaryStateIterations_ > maxIterations_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "maxStationaryStateIterations_ ( %lu ) "
               "must be less than maxIterations_ ( %lu )\n",
               (unsigned long)maxStationaryStateIterations_,
               (unsigned long)maxIterations_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
  }